

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O2

ObjectPair __thiscall arangodb::velocypack::ObjectIterator::operator*(ObjectIterator *this)

{
  uint8_t *puVar1;
  Slice SVar2;
  ValueLength VVar3;
  Slice SVar4;
  ObjectPair OVar5;
  Slice key;
  uint8_t *local_20;
  
  local_20 = this->_current;
  if (local_20 == (uint8_t *)0x0) {
    local_20 = (uint8_t *)
               SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
               getNthKeyUntranslated
                         ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                          this,this->_position);
    SVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::makeKey
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_20);
    puVar1 = local_20;
    VVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_20);
    SVar4._start = puVar1 + VVar3;
  }
  else {
    SVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::makeKey
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_20);
    puVar1 = this->_current;
    VVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_20);
    SVar4._start = puVar1 + VVar3;
  }
  OVar5.value._start = SVar4._start;
  OVar5.key._start = SVar2._start;
  return OVar5;
}

Assistant:

[[nodiscard]] ObjectPair operator*() const {
    if (_current != nullptr) {
      Slice key{_current};
      return {key.makeKey(), Slice(_current + key.byteSize())};
    }
    // intentionally no out-of-bounds checking here,
    // as it will be performed by Slice::getNthOffset()
    Slice key{_slice.getNthKeyUntranslated(_position)};
    return {key.makeKey(), Slice(key.begin() + key.byteSize())};
  }